

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O0

int __thiscall Clasp::PropagatorList::remove(PropagatorList *this,char *__filename)

{
  PostPropagator *pPVar1;
  PostPropagator *x;
  PostPropagator **r;
  PostPropagator **local_18;
  
  if (__filename == (char *)0x0) {
    Potassco::fail(-2,"void Clasp::PropagatorList::remove(PostPropagator *)",0x55,"p",
                   "Invalid post propagator",0);
  }
  local_18 = head(this);
  do {
    if (*local_18 == (PostPropagator *)0x0) {
LAB_00233437:
      return (int)local_18;
    }
    pPVar1 = *local_18;
    if (pPVar1 == (PostPropagator *)__filename) {
      *local_18 = pPVar1->next;
      __filename[8] = '\0';
      __filename[9] = '\0';
      __filename[10] = '\0';
      __filename[0xb] = '\0';
      __filename[0xc] = '\0';
      __filename[0xd] = '\0';
      __filename[0xe] = '\0';
      __filename[0xf] = '\0';
      local_18 = (PostPropagator **)__filename;
      goto LAB_00233437;
    }
    local_18 = &pPVar1->next;
  } while( true );
}

Assistant:

void PropagatorList::remove(PostPropagator* p) {
	POTASSCO_REQUIRE(p, "Invalid post propagator");
	for (PostPropagator** r = head(), *x; *r; r = &x->next) {
		if ((x = *r) == p) {
			*r      = x->next;
			p->next = 0;
			break;
		}
	}
}